

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O0

void __thiscall
cfd::core::CfdException::CfdException(CfdException *this,CfdError error_code,string *message)

{
  string *in_RDX;
  undefined4 in_ESI;
  exception *in_RDI;
  
  ::std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__CfdException_009efc70;
  *(undefined4 *)(in_RDI + 8) = in_ESI;
  ::std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RDX);
  return;
}

Assistant:

CfdException(CfdError error_code, const std::string& message)
      : error_code_(error_code), message_(message) {}